

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfdcapi_elements_address.cpp
# Opt level: O1

void __thiscall
cfdcapi_elements_address_GetPegoutAddress_Test::TestBody
          (cfdcapi_elements_address_GetPegoutAddress_Test *this)

{
  bool bVar1;
  void *__dest;
  char *pcVar2;
  char *in_R9;
  long lVar3;
  char *base_descriptor;
  AssertHelper local_80;
  ScopedTrace gtest_trace_353;
  int ret;
  AssertionResult gtest_ar_;
  AssertionResult gtest_ar;
  undefined1 local_50 [16];
  void *handle;
  AssertHelper local_38;
  
  handle = (void *)0x0;
  ret = CfdCreateHandle(&handle);
  gtest_ar_._0_8_ = (ulong)(uint)gtest_ar_._4_4_ << 0x20;
  testing::internal::CmpHelperEQ<CfdErrorCode,int>
            ((internal *)&gtest_ar,"kCfdSuccess","ret",(CfdErrorCode *)&gtest_ar_,&ret);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&base_descriptor,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_elements_address.cpp"
               ,0xaf,pcVar2);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&base_descriptor,(Message *)&gtest_ar_);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&base_descriptor);
    if (gtest_ar_._0_8_ != 0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && (gtest_ar_._0_8_ != 0)) {
        (**(code **)(*(long *)gtest_ar_._0_8_ + 8))();
      }
      gtest_ar_.success_ = false;
      gtest_ar_._1_7_ = 0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&gtest_ar.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  gtest_ar_.success_ = handle != (void *)0x0;
  gtest_ar_.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
  ;
  if (handle == (void *)0x0) {
    testing::Message::Message((Message *)&base_descriptor);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar,(internal *)&gtest_ar_,(AssertionResult *)"(NULL == handle)",
               "true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_80,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_elements_address.cpp"
               ,0xb0,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
    testing::internal::AssertHelper::operator=(&local_80,(Message *)&base_descriptor);
    testing::internal::AssertHelper::~AssertHelper(&local_80);
    if ((undefined1 *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_) != local_50) {
      operator_delete((undefined1 *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
    }
    if (base_descriptor != (char *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && (base_descriptor != (char *)0x0)) {
        (**(code **)(*(long *)base_descriptor + 8))();
      }
      base_descriptor = (char *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&gtest_ar_.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
       );
  __dest = operator_new(0x300);
  memcpy(__dest,&PTR_anon_var_dwarf_439156_0073beb0,0x300);
  lVar3 = 0x28;
  do {
    testing::ScopedTrace::ScopedTrace
              (&gtest_trace_353,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_elements_address.cpp"
               ,0x161,*(char **)((long)__dest + lVar3 + -0x28));
    gtest_ar_.success_ = false;
    gtest_ar_._1_7_ = 0;
    base_descriptor = (char *)0x0;
    ret = CfdGetPegoutAddress(handle,*(int *)((long)__dest + lVar3 + -0x14),
                              *(int *)((long)__dest + lVar3 + -0x10),
                              *(char **)((long)__dest + lVar3 + -0x20),
                              *(uint32_t *)((long)__dest + lVar3 + -0x18),
                              *(int *)((long)__dest + lVar3 + -0xc),(char **)&gtest_ar_,
                              &base_descriptor);
    local_80.data_ = local_80.data_ & 0xffffffff00000000;
    testing::internal::CmpHelperEQ<CfdErrorCode,int>
              ((internal *)&gtest_ar,"kCfdSuccess","ret",(CfdErrorCode *)&local_80,&ret);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&local_80);
      pcVar2 = "";
      if (gtest_ar.message_.ptr_ !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_38,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_elements_address.cpp"
                 ,0x169,pcVar2);
      testing::internal::AssertHelper::operator=(&local_38,(Message *)&local_80);
      testing::internal::AssertHelper::~AssertHelper(&local_38);
      if (local_80.data_ != (AssertHelperData *)0x0) {
        bVar1 = testing::internal::IsTrue(true);
        if ((bVar1) && (local_80.data_ != (AssertHelperData *)0x0)) {
          (**(code **)(*(long *)local_80.data_ + 8))();
        }
        local_80.data_ = (AssertHelperData *)0x0;
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&gtest_ar.message_,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    if (ret == 0) {
      testing::internal::CmpHelperSTREQ
                ((internal *)&gtest_ar,"test_data.exp_address","mainchain_address",
                 *(char **)((long)__dest + lVar3 + -8),(char *)gtest_ar_._0_8_);
      if (gtest_ar.success_ == false) {
        testing::Message::Message((Message *)&local_80);
        pcVar2 = "";
        if (gtest_ar.message_.ptr_ !=
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_38,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_elements_address.cpp"
                   ,0x16b,pcVar2);
        testing::internal::AssertHelper::operator=(&local_38,(Message *)&local_80);
        testing::internal::AssertHelper::~AssertHelper(&local_38);
        if (local_80.data_ != (AssertHelperData *)0x0) {
          bVar1 = testing::internal::IsTrue(true);
          if ((bVar1) && (local_80.data_ != (AssertHelperData *)0x0)) {
            (**(code **)(*(long *)local_80.data_ + 8))();
          }
          local_80.data_ = (AssertHelperData *)0x0;
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&gtest_ar.message_,
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      testing::internal::CmpHelperSTREQ
                ((internal *)&gtest_ar,"test_data.exp_base_descriptor","base_descriptor",
                 *(char **)((long)__dest + lVar3),base_descriptor);
      if (gtest_ar.success_ == false) {
        testing::Message::Message((Message *)&local_80);
        pcVar2 = "";
        if (gtest_ar.message_.ptr_ !=
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_38,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_elements_address.cpp"
                   ,0x16c,pcVar2);
        testing::internal::AssertHelper::operator=(&local_38,(Message *)&local_80);
        testing::internal::AssertHelper::~AssertHelper(&local_38);
        if (local_80.data_ != (AssertHelperData *)0x0) {
          bVar1 = testing::internal::IsTrue(true);
          if ((bVar1) && (local_80.data_ != (AssertHelperData *)0x0)) {
            (**(code **)(*(long *)local_80.data_ + 8))();
          }
          local_80.data_ = (AssertHelperData *)0x0;
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&gtest_ar.message_,
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      CfdFreeStringBuffer((char *)gtest_ar_._0_8_);
      CfdFreeStringBuffer(base_descriptor);
    }
    testing::ScopedTrace::~ScopedTrace(&gtest_trace_353);
    lVar3 = lVar3 + 0x30;
  } while (lVar3 != 0x328);
  ret = CfdGetLastErrorCode(handle);
  if (ret != 0) {
    gtest_ar_.success_ = false;
    gtest_ar_._1_7_ = 0;
    ret = CfdGetLastErrorMessage(handle,(char **)&gtest_ar_);
    base_descriptor = (char *)((ulong)base_descriptor & 0xffffffff00000000);
    testing::internal::CmpHelperEQ<CfdErrorCode,int>
              ((internal *)&gtest_ar,"kCfdSuccess","ret",(CfdErrorCode *)&base_descriptor,&ret);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&base_descriptor);
      if (gtest_ar.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar2 = "";
      }
      else {
        pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_80,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_elements_address.cpp"
                 ,0x176,pcVar2);
      testing::internal::AssertHelper::operator=(&local_80,(Message *)&base_descriptor);
      testing::internal::AssertHelper::~AssertHelper(&local_80);
      if (base_descriptor != (char *)0x0) {
        bVar1 = testing::internal::IsTrue(true);
        if ((bVar1) && (base_descriptor != (char *)0x0)) {
          (**(code **)(*(long *)base_descriptor + 8))();
        }
        base_descriptor = (char *)0x0;
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&gtest_ar.message_,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    pcVar2 = "";
    testing::internal::CmpHelperSTREQ
              ((internal *)&gtest_ar,"\"\"","str_buffer","",(char *)gtest_ar_._0_8_);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&base_descriptor);
      if (gtest_ar.message_.ptr_ !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_80,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_elements_address.cpp"
                 ,0x177,pcVar2);
      testing::internal::AssertHelper::operator=(&local_80,(Message *)&base_descriptor);
      testing::internal::AssertHelper::~AssertHelper(&local_80);
      if (base_descriptor != (char *)0x0) {
        bVar1 = testing::internal::IsTrue(true);
        if ((bVar1) && (base_descriptor != (char *)0x0)) {
          (**(code **)(*(long *)base_descriptor + 8))();
        }
        base_descriptor = (char *)0x0;
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&gtest_ar.message_,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    CfdFreeStringBuffer((char *)gtest_ar_._0_8_);
  }
  ret = CfdFreeHandle(handle);
  gtest_ar_._0_8_ = gtest_ar_._0_8_ & 0xffffffff00000000;
  testing::internal::CmpHelperEQ<CfdErrorCode,int>
            ((internal *)&gtest_ar,"kCfdSuccess","ret",(CfdErrorCode *)&gtest_ar_,&ret);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&base_descriptor,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_elements_address.cpp"
               ,0x17d,pcVar2);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&base_descriptor,(Message *)&gtest_ar_);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&base_descriptor);
    if (gtest_ar_._0_8_ != 0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && (gtest_ar_._0_8_ != 0)) {
        (**(code **)(*(long *)gtest_ar_._0_8_ + 8))();
      }
      gtest_ar_.success_ = false;
      gtest_ar_._1_7_ = 0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&gtest_ar.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  operator_delete(__dest);
  return;
}

Assistant:

TEST(cfdcapi_elements_address, GetPegoutAddress) {
  void* handle = NULL;
  int ret = CfdCreateHandle(&handle);
  EXPECT_EQ(kCfdSuccess, ret);
  EXPECT_FALSE((NULL == handle));

  struct CfdCapiTestPegoutAddressData {
    const char* name;
    const char* descriptor;
    uint32_t counter;
    int mainchain_net_type;
    int elements_net_type;
    int address_type;
    const char* exp_address;
    const char* exp_base_descriptor;
  };

  std::vector<CfdCapiTestPegoutAddressData> test_case = {
    {
      "extkey - p2pkh - regtest",
      "tpubDASgDECJvTMzUgS7GkSCxQAAWPveW7BeTPSvbi1wpUe1Mq1v743FRw1i7vTavjAb3D3Y8geCTYw2ezgiVS7SFXDXS6NpZmvr6XPjPvg632y",
      0,
      kCfdNetworkRegtest,
      kCfdNetworkElementsRegtest,
      kCfdP2pkhAddress,
      "n3Na7mek1zAStRxvt7RPrNCpZhDErMPkGw",
      "pkh(tpubDASgDECJvTMzUgS7GkSCxQAAWPveW7BeTPSvbi1wpUe1Mq1v743FRw1i7vTavjAb3D3Y8geCTYw2ezgiVS7SFXDXS6NpZmvr6XPjPvg632y)"
    },
    {
      "descriptor - p2pkh - regtest",
      "pkh(tpubDASgDECJvTMzUgS7GkSCxQAAWPveW7BeTPSvbi1wpUe1Mq1v743FRw1i7vTavjAb3D3Y8geCTYw2ezgiVS7SFXDXS6NpZmvr6XPjPvg632y)",
      0,
      kCfdNetworkRegtest,
      kCfdNetworkElementsRegtest,
      kCfdP2pkhAddress,
      "n3Na7mek1zAStRxvt7RPrNCpZhDErMPkGw",
      "pkh(tpubDASgDECJvTMzUgS7GkSCxQAAWPveW7BeTPSvbi1wpUe1Mq1v743FRw1i7vTavjAb3D3Y8geCTYw2ezgiVS7SFXDXS6NpZmvr6XPjPvg632y)"
    },
    {
      "deriveDescriptor - p2pkh - regtest",
      "pkh(tpubDASgDECJvTMzUgS7GkSCxQAAWPveW7BeTPSvbi1wpUe1Mq1v743FRw1i7vTavjAb3D3Y8geCTYw2ezgiVS7SFXDXS6NpZmvr6XPjPvg632y/0/*)",
      0,
      kCfdNetworkRegtest,
      kCfdNetworkElementsRegtest,
      kCfdP2pkhAddress,
      "n3Na7mek1zAStRxvt7RPrNCpZhDErMPkGw",
      "pkh(tpubDASgDECJvTMzUgS7GkSCxQAAWPveW7BeTPSvbi1wpUe1Mq1v743FRw1i7vTavjAb3D3Y8geCTYw2ezgiVS7SFXDXS6NpZmvr6XPjPvg632y)"
    },
    {
      "extkey - p2pkh - mainnet",
      "xpub67v4wfueMiZVkc7UbutFgPiptQw4kkNs89ooNMrwht8xEjnZZim1rNZHhEdrLejB99fiBdnWNNAB8hmUK7tCo5Ua6UtHzwVLj2Bzpch7vB2",
      0,
      kCfdNetworkMainnet,
      kCfdNetworkLiquidv1,
      kCfdP2pkhAddress,
      "1MMxsm4QG8NRHqaFZaUTFQQ9c9dEHUPWnD",
      "pkh(xpub67v4wfueMiZVkc7UbutFgPiptQw4kkNs89ooNMrwht8xEjnZZim1rNZHhEdrLejB99fiBdnWNNAB8hmUK7tCo5Ua6UtHzwVLj2Bzpch7vB2)"
    },
    {
      "descriptor - p2pkh - mainnet",
      "pkh(xpub67v4wfueMiZVkc7UbutFgPiptQw4kkNs89ooNMrwht8xEjnZZim1rNZHhEdrLejB99fiBdnWNNAB8hmUK7tCo5Ua6UtHzwVLj2Bzpch7vB2)",
      0,
      kCfdNetworkMainnet,
      kCfdNetworkLiquidv1,
      kCfdP2pkhAddress,
      "1MMxsm4QG8NRHqaFZaUTFQQ9c9dEHUPWnD",
      "pkh(xpub67v4wfueMiZVkc7UbutFgPiptQw4kkNs89ooNMrwht8xEjnZZim1rNZHhEdrLejB99fiBdnWNNAB8hmUK7tCo5Ua6UtHzwVLj2Bzpch7vB2)"
    },
    {
      "deriveDescriptor - p2pkh - mainnet",
      "pkh(xpub67v4wfueMiZVkc7UbutFgPiptQw4kkNs89ooNMrwht8xEjnZZim1rNZHhEdrLejB99fiBdnWNNAB8hmUK7tCo5Ua6UtHzwVLj2Bzpch7vB2/0/*)",
      0,
      kCfdNetworkMainnet,
      kCfdNetworkLiquidv1,
      kCfdP2pkhAddress,
      "1MMxsm4QG8NRHqaFZaUTFQQ9c9dEHUPWnD",
      "pkh(xpub67v4wfueMiZVkc7UbutFgPiptQw4kkNs89ooNMrwht8xEjnZZim1rNZHhEdrLejB99fiBdnWNNAB8hmUK7tCo5Ua6UtHzwVLj2Bzpch7vB2)"
    },
    {
      "extkey - p2wpkh - regtest",
      "tpubDASgDECJvTMzUgS7GkSCxQAAWPveW7BeTPSvbi1wpUe1Mq1v743FRw1i7vTavjAb3D3Y8geCTYw2ezgiVS7SFXDXS6NpZmvr6XPjPvg632y",
      0,
      kCfdNetworkRegtest,
      kCfdNetworkElementsRegtest,
      kCfdP2wpkhAddress,
      "bcrt1qa77w63m523kq82z4fn3d5f7qxqxfm4pmdthkdf",
      "wpkh(tpubDASgDECJvTMzUgS7GkSCxQAAWPveW7BeTPSvbi1wpUe1Mq1v743FRw1i7vTavjAb3D3Y8geCTYw2ezgiVS7SFXDXS6NpZmvr6XPjPvg632y)"
    },
    {
      "descriptor - p2wpkh - regtest",
      "wpkh(tpubDASgDECJvTMzUgS7GkSCxQAAWPveW7BeTPSvbi1wpUe1Mq1v743FRw1i7vTavjAb3D3Y8geCTYw2ezgiVS7SFXDXS6NpZmvr6XPjPvg632y)",
      0,
      kCfdNetworkRegtest,
      kCfdNetworkElementsRegtest,
      kCfdP2wpkhAddress,
      "bcrt1qa77w63m523kq82z4fn3d5f7qxqxfm4pmdthkdf",
      "wpkh(tpubDASgDECJvTMzUgS7GkSCxQAAWPveW7BeTPSvbi1wpUe1Mq1v743FRw1i7vTavjAb3D3Y8geCTYw2ezgiVS7SFXDXS6NpZmvr6XPjPvg632y)"
    },
    {
      "deriveDescriptor - p2wpkh - regtest",
      "wpkh(tpubDASgDECJvTMzUgS7GkSCxQAAWPveW7BeTPSvbi1wpUe1Mq1v743FRw1i7vTavjAb3D3Y8geCTYw2ezgiVS7SFXDXS6NpZmvr6XPjPvg632y/0/*)",
      0,
      kCfdNetworkRegtest,
      kCfdNetworkElementsRegtest,
      kCfdP2wpkhAddress,
      "bcrt1qa77w63m523kq82z4fn3d5f7qxqxfm4pmdthkdf",
      "wpkh(tpubDASgDECJvTMzUgS7GkSCxQAAWPveW7BeTPSvbi1wpUe1Mq1v743FRw1i7vTavjAb3D3Y8geCTYw2ezgiVS7SFXDXS6NpZmvr6XPjPvg632y)"
    },
    {
      "extkey - p2sh-p2wpkh - regtest",
      "tpubDASgDECJvTMzUgS7GkSCxQAAWPveW7BeTPSvbi1wpUe1Mq1v743FRw1i7vTavjAb3D3Y8geCTYw2ezgiVS7SFXDXS6NpZmvr6XPjPvg632y",
      0,
      kCfdNetworkRegtest,
      kCfdNetworkElementsRegtest,
      kCfdP2shP2wpkhAddress,
      "2N8UxQ5u9YXYFn6Ukj5KGXCMDUZTixKTXHo",
      "sh(wpkh(tpubDASgDECJvTMzUgS7GkSCxQAAWPveW7BeTPSvbi1wpUe1Mq1v743FRw1i7vTavjAb3D3Y8geCTYw2ezgiVS7SFXDXS6NpZmvr6XPjPvg632y))"
    },
    {
      "descriptor - p2sh-p2wpkh - regtest",
      "sh(wpkh(tpubDASgDECJvTMzUgS7GkSCxQAAWPveW7BeTPSvbi1wpUe1Mq1v743FRw1i7vTavjAb3D3Y8geCTYw2ezgiVS7SFXDXS6NpZmvr6XPjPvg632y))",
      0,
      kCfdNetworkRegtest,
      kCfdNetworkElementsRegtest,
      kCfdP2shP2wpkhAddress,
      "2N8UxQ5u9YXYFn6Ukj5KGXCMDUZTixKTXHo",
      "sh(wpkh(tpubDASgDECJvTMzUgS7GkSCxQAAWPveW7BeTPSvbi1wpUe1Mq1v743FRw1i7vTavjAb3D3Y8geCTYw2ezgiVS7SFXDXS6NpZmvr6XPjPvg632y))"
    },
    {
      "deriveDescriptor - p2sh-p2wpkh - regtest",
      "sh(wpkh(tpubDASgDECJvTMzUgS7GkSCxQAAWPveW7BeTPSvbi1wpUe1Mq1v743FRw1i7vTavjAb3D3Y8geCTYw2ezgiVS7SFXDXS6NpZmvr6XPjPvg632y/0/*))",
      0,
      kCfdNetworkRegtest,
      kCfdNetworkElementsRegtest,
      kCfdP2shP2wpkhAddress,
      "2N8UxQ5u9YXYFn6Ukj5KGXCMDUZTixKTXHo",
      "sh(wpkh(tpubDASgDECJvTMzUgS7GkSCxQAAWPveW7BeTPSvbi1wpUe1Mq1v743FRw1i7vTavjAb3D3Y8geCTYw2ezgiVS7SFXDXS6NpZmvr6XPjPvg632y))"
    },
    {
      "extkey - p2pkh - regtest - count 1",
      "tpubDASgDECJvTMzUgS7GkSCxQAAWPveW7BeTPSvbi1wpUe1Mq1v743FRw1i7vTavjAb3D3Y8geCTYw2ezgiVS7SFXDXS6NpZmvr6XPjPvg632y",
      1,
      kCfdNetworkRegtest,
      kCfdNetworkElementsRegtest,
      kCfdP2pkhAddress,
      "mjii5Qey7jLxtvsV5f6BaFeVaqfeqcKXzL",
      "pkh(tpubDASgDECJvTMzUgS7GkSCxQAAWPveW7BeTPSvbi1wpUe1Mq1v743FRw1i7vTavjAb3D3Y8geCTYw2ezgiVS7SFXDXS6NpZmvr6XPjPvg632y)"
    },
    {
      "descriptor - p2pkh - regtest - count 1",
      "pkh(tpubDASgDECJvTMzUgS7GkSCxQAAWPveW7BeTPSvbi1wpUe1Mq1v743FRw1i7vTavjAb3D3Y8geCTYw2ezgiVS7SFXDXS6NpZmvr6XPjPvg632y)",
      1,
      kCfdNetworkRegtest,
      kCfdNetworkElementsRegtest,
      kCfdP2pkhAddress,
      "mjii5Qey7jLxtvsV5f6BaFeVaqfeqcKXzL",
      "pkh(tpubDASgDECJvTMzUgS7GkSCxQAAWPveW7BeTPSvbi1wpUe1Mq1v743FRw1i7vTavjAb3D3Y8geCTYw2ezgiVS7SFXDXS6NpZmvr6XPjPvg632y)"
    },
    {
      "deriveDescriptor - p2pkh - regtest - count 1",
      "pkh(tpubDASgDECJvTMzUgS7GkSCxQAAWPveW7BeTPSvbi1wpUe1Mq1v743FRw1i7vTavjAb3D3Y8geCTYw2ezgiVS7SFXDXS6NpZmvr6XPjPvg632y/0/*)",
      1,
      kCfdNetworkRegtest,
      kCfdNetworkElementsRegtest,
      kCfdP2pkhAddress,
      "mjii5Qey7jLxtvsV5f6BaFeVaqfeqcKXzL",
      "pkh(tpubDASgDECJvTMzUgS7GkSCxQAAWPveW7BeTPSvbi1wpUe1Mq1v743FRw1i7vTavjAb3D3Y8geCTYw2ezgiVS7SFXDXS6NpZmvr6XPjPvg632y)"
    },
    {
      "deriveDescriptor - p2pkh - regtest - count max",
      "pkh(tpubDASgDECJvTMzUgS7GkSCxQAAWPveW7BeTPSvbi1wpUe1Mq1v743FRw1i7vTavjAb3D3Y8geCTYw2ezgiVS7SFXDXS6NpZmvr6XPjPvg632y/0/*)",
      0x7fffffff,
      kCfdNetworkRegtest,
      kCfdNetworkElementsRegtest,
      kCfdP2pkhAddress,
      "mfkLVoxUp9K2Q1KeRr3Ewnn414jLSCTGmn",
      "pkh(tpubDASgDECJvTMzUgS7GkSCxQAAWPveW7BeTPSvbi1wpUe1Mq1v743FRw1i7vTavjAb3D3Y8geCTYw2ezgiVS7SFXDXS6NpZmvr6XPjPvg632y)"
    },
  };

  for (const auto& test_data : test_case) {
    SCOPED_TRACE(test_data.name);

    char* mainchain_address = nullptr;
    char* base_descriptor = nullptr;
    ret = CfdGetPegoutAddress(
        handle, test_data.mainchain_net_type, test_data.elements_net_type,
        test_data.descriptor, test_data.counter, test_data.address_type,
        &mainchain_address, &base_descriptor);
    EXPECT_EQ(kCfdSuccess, ret);
    if (ret == kCfdSuccess) {
      EXPECT_STREQ(test_data.exp_address, mainchain_address);
      EXPECT_STREQ(test_data.exp_base_descriptor, base_descriptor);
      CfdFreeStringBuffer(mainchain_address);
      CfdFreeStringBuffer(base_descriptor);
    }
  }

  ret = CfdGetLastErrorCode(handle);
  if (ret != kCfdSuccess) {
    char* str_buffer = NULL;
    ret = CfdGetLastErrorMessage(handle, &str_buffer);
    EXPECT_EQ(kCfdSuccess, ret);
    EXPECT_STREQ("", str_buffer);
    CfdFreeStringBuffer(str_buffer);
    str_buffer = NULL;
  }

  ret = CfdFreeHandle(handle);
  EXPECT_EQ(kCfdSuccess, ret);
}